

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

double exp_bounded(double v)

{
  double dVar1;
  
  if (v <= 700.0) {
    dVar1 = 0.0;
    if (-700.0 <= v) {
      dVar1 = exp(v);
      return dVar1;
    }
  }
  else {
    dVar1 = 1.79769313486232e+308;
  }
  return dVar1;
}

Assistant:

static inline double exp_bounded(double v) {
  // When v > 700 or <-700, the exp function will be close to overflow
  // For details, see the "Notes" in the following link.
  // https://en.cppreference.com/w/c/numeric/math/exp
  if (v > 700) {
    return DBL_MAX;
  } else if (v < -700) {
    return 0;
  }
  return exp(v);
}